

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::StrPair::CollapseWhitespace(StrPair *this)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar3 = (byte *)this->_start;
  bVar1 = *pbVar3;
  while ((-1 < (char)bVar1 && (iVar2 = isspace((uint)bVar1), iVar2 != 0))) {
    bVar1 = pbVar3[1];
    pbVar3 = pbVar3 + 1;
  }
  this->_start = (char *)pbVar3;
  bVar1 = *pbVar3;
  pbVar4 = pbVar3;
  if (bVar1 != 0) {
    do {
      if ((-1 < (char)bVar1) && (iVar2 = isspace((uint)bVar1), iVar2 != 0)) {
        do {
          iVar2 = isspace((uint)bVar1);
          if (iVar2 == 0) {
            if (bVar1 == 0) goto LAB_00116f82;
            break;
          }
          bVar1 = pbVar3[1];
          pbVar3 = pbVar3 + 1;
        } while (-1 < (char)bVar1);
        *pbVar4 = 0x20;
        pbVar4 = pbVar4 + 1;
        bVar1 = *pbVar3;
      }
      *pbVar4 = bVar1;
      pbVar4 = pbVar4 + 1;
      bVar1 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
LAB_00116f82:
    *pbVar4 = 0;
  }
  return;
}

Assistant:

void StrPair::CollapseWhitespace()
{
    // Adjusting _start would cause undefined behavior on delete[]
    TIXMLASSERT( ( _flags & NEEDS_DELETE ) == 0 );
    // Trim leading space.
    _start = XMLUtil::SkipWhiteSpace( _start, 0 );

    if ( *_start ) {
        const char* p = _start;	// the read pointer
        char* q = _start;	// the write pointer

        while( *p ) {
            if ( XMLUtil::IsWhiteSpace( *p )) {
                p = XMLUtil::SkipWhiteSpace( p, 0 );
                if ( *p == 0 ) {
                    break;    // don't write to q; this trims the trailing space.
                }
                *q = ' ';
                ++q;
            }
            *q = *p;
            ++q;
            ++p;
        }
        *q = 0;
    }
}